

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

qulonglong __thiscall QVariant::toULongLong(QVariant *this,bool *ok)

{
  unsigned_long_long uVar1;
  bool *in_RDI;
  Private *unaff_retaddr;
  
  uVar1 = qNumVariantToHelper<unsigned_long_long>(unaff_retaddr,in_RDI);
  return uVar1;
}

Assistant:

qulonglong QVariant::toULongLong(bool *ok) const
{
    return qNumVariantToHelper<qulonglong>(d, ok);
}